

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O0

AngleAxis *
stateObservation::kine::rotationVectorToAngleAxis(AngleAxis *__return_storage_ptr__,Vector3 *v)

{
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_68 [32];
  Scalar local_48;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_40;
  RealScalar local_20;
  double angle;
  Vector3 *v_local;
  
  angle = (double)v;
  v_local = &__return_storage_ptr__->m_axis;
  local_20 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::squaredNorm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)v);
  if (local_20 <= 9.999999999999999e-33) {
    local_48 = 0.0;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
    Eigen::AngleAxis<double>::
    AngleAxis<Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>>
              (__return_storage_ptr__,&local_48,local_68);
  }
  else {
    local_20 = sqrt(local_20);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (&local_40,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)angle,&local_20);
    Eigen::AngleAxis<double>::
    AngleAxis<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              (__return_storage_ptr__,&local_20,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AngleAxis rotationVectorToAngleAxis(const Vector3 & v)
{
  double angle(v.squaredNorm());
  if(angle > cst::epsilonAngle * cst::epsilonAngle)
  {
    angle = sqrt(angle);
    return AngleAxis(angle, v / angle);
  }
  else
  {
    return AngleAxis(0.0, Vector3::UnitZ());
  }
}